

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<char> * __thiscall
kj::ArrayBuilder<char>::operator=(ArrayBuilder<char> *this,ArrayBuilder<char> *other)

{
  ArrayBuilder<char> *other_local;
  ArrayBuilder<char> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (char *)0x0;
  other->pos = (RemoveConst<char> *)0x0;
  other->endPtr = (char *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }